

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::upToFirst
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  char in_CL;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  ulong extraout_RDX;
  char *__s;
  int iVar9;
  uint uVar10;
  VerySimpleReadOnlyString VVar11;
  
  uVar1 = find->length;
  pcVar3 = find->data;
  uVar2 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  iVar9 = 0;
  uVar8 = 0;
  do {
    uVar6 = (uint)uVar8;
    uVar7 = uVar6;
    if (uVar6 < uVar1) {
      uVar7 = uVar1;
    }
    uVar10 = 0;
    while( true ) {
      if (uVar7 + iVar9 == uVar10) {
        uVar8 = (ulong)uVar1;
        goto LAB_00115014;
      }
      if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar10) !=
          pcVar3[uVar6 + uVar10]) break;
      uVar10 = uVar10 + 1;
      if (uVar2 == uVar10) {
LAB_00115014:
        __s = "";
        if (in_CL == '\0') {
          __s = pcVar3;
        }
        uVar7 = (uint)uVar8;
        if (uVar7 != uVar1) {
          __s = pcVar3;
        }
        uVar4 = (ulong)(uVar2 + uVar7);
        if (uVar7 == uVar1) {
          uVar4 = 0;
        }
        if (in_CL == '\0') {
          uVar4 = uVar8;
        }
        this->data = __s;
        iVar9 = (int)uVar4;
        if ((iVar9 == -1) && (iVar9 = 0, __s != (char *)0x0)) {
          sVar5 = strlen(__s);
          iVar9 = (int)sVar5;
          uVar8 = extraout_RDX;
        }
        this->length = iVar9;
        VVar11._8_8_ = uVar8;
        VVar11.data = (tCharPtr)this;
        return VVar11;
      }
    }
    uVar8 = (ulong)(uVar6 + 1);
    iVar9 = iVar9 + -1;
  } while( true );
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::upToFirst(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length && includeFind ? "" : data, includeFind ? (pos == (unsigned int)length ? 0 : pos + (unsigned int)find.length) : pos);
	}